

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O1

void __thiscall psy::C::SemanticModelTester::case0400(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TagDeclarationSymbol *this_00;
  TagType *pTVar3;
  Lexeme *pLVar4;
  undefined8 uVar5;
  ostream *poVar6;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  SemanticModel *local_30;
  EnumDeclarationSyntax *local_28;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"enum x { y } ;","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  compile<psy::C::EnumDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_70);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = &SemanticModel::enumFor(local_30,local_28)->super_TagDeclarationSymbol;
  if (this_00 == (TagDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x2e3);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    pTVar3 = TagDeclarationSymbol::introducedNewType(this_00);
    pLVar4 = &TagType::tag(pTVar3)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_70,pLVar4);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    pTVar3 = TagDeclarationSymbol::introducedNewType(this_00);
    pLVar4 = &TagType::tag(pTVar3)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_70,pLVar4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\tExpected: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x2e4);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_70);
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0400()
{
    auto [enumDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y } ;");

    const EnumDeclarationSymbol* enun = semaModel->enumFor(enumDeclNode);
    PSY_EXPECT_TRUE(enun);
    PSY_EXPECT_EQ_STR(enun->introducedNewType()->tag()->valueText(), "x");
}